

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiEdataDec(octet *edata,size_t *edata_len,octet *salt,size_t *iter,octet *epki,size_t count
                   )

{
  octet **ppoVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  octet *der;
  size_t *len;
  octet *der_00;
  der_anchor_t *anchor;
  size_t t_22;
  size_t t_21;
  size_t t_20;
  size_t t_19;
  size_t t_18;
  size_t t_17;
  size_t t_16;
  size_t t_15;
  size_t t_14;
  size_t t_13;
  size_t t_12;
  size_t t_11;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  octet *ptr;
  der_anchor_t BeltKwpAlgId [1];
  der_anchor_t PrfAlgId [1];
  der_anchor_t PBKDF2_params [1];
  der_anchor_t PBKDF2AlgId [1];
  der_anchor_t PBES2_params [1];
  der_anchor_t EncryptionAlgId [1];
  der_anchor_t EPKI [1];
  size_t in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  u32 tag;
  size_t in_stack_fffffffffffffe38;
  der_anchor_t *in_stack_fffffffffffffe40;
  der_anchor_t *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  octet *in_stack_fffffffffffffe58;
  octet *in_stack_fffffffffffffe60;
  size_t *in_stack_fffffffffffffe68;
  octet *local_8;
  
  tag = (u32)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  sVar2 = derTSEQDecStart(in_stack_fffffffffffffe48,(octet *)in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38,tag);
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = (octet *)0xffffffffffffffff;
  }
  else {
    sVar3 = derTSEQDecStart(in_stack_fffffffffffffe48,(octet *)in_stack_fffffffffffffe40,
                            in_stack_fffffffffffffe38,tag);
    if (sVar3 == 0xffffffffffffffff) {
      local_8 = (octet *)0xffffffffffffffff;
    }
    else {
      sVar4 = derOIDDec2(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         (char *)in_stack_fffffffffffffe48);
      if (sVar4 == 0xffffffffffffffff) {
        local_8 = (octet *)0xffffffffffffffff;
      }
      else {
        sVar5 = derTSEQDecStart(in_stack_fffffffffffffe48,(octet *)in_stack_fffffffffffffe40,
                                in_stack_fffffffffffffe38,tag);
        if (sVar5 == 0xffffffffffffffff) {
          local_8 = (octet *)0xffffffffffffffff;
        }
        else {
          sVar6 = derTSEQDecStart(in_stack_fffffffffffffe48,(octet *)in_stack_fffffffffffffe40,
                                  in_stack_fffffffffffffe38,tag);
          if (sVar6 == 0xffffffffffffffff) {
            local_8 = (octet *)0xffffffffffffffff;
          }
          else {
            sVar7 = derOIDDec2(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                               (char *)in_stack_fffffffffffffe48);
            if (sVar7 == 0xffffffffffffffff) {
              local_8 = (octet *)0xffffffffffffffff;
            }
            else {
              sVar8 = derTSEQDecStart(in_stack_fffffffffffffe48,(octet *)in_stack_fffffffffffffe40,
                                      in_stack_fffffffffffffe38,tag);
              if (sVar8 == 0xffffffffffffffff) {
                local_8 = (octet *)0xffffffffffffffff;
              }
              else {
                sVar9 = derTOCTDec2((octet *)in_stack_fffffffffffffe48,
                                    (octet *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,tag
                                    ,in_stack_fffffffffffffe28);
                if (sVar9 == 0xffffffffffffffff) {
                  local_8 = (octet *)0xffffffffffffffff;
                }
                else {
                  sVar10 = derTSIZEDec(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                                       (size_t)in_stack_fffffffffffffe58,
                                       (u32)(in_stack_fffffffffffffe50 >> 0x20));
                  if (sVar10 == 0xffffffffffffffff) {
                    local_8 = (octet *)0xffffffffffffffff;
                  }
                  else {
                    sVar11 = derTSEQDecStart(in_stack_fffffffffffffe48,
                                             (octet *)in_stack_fffffffffffffe40,
                                             in_stack_fffffffffffffe38,tag);
                    if (sVar11 == 0xffffffffffffffff) {
                      local_8 = (octet *)0xffffffffffffffff;
                    }
                    else {
                      sVar12 = derOIDDec2(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                          (char *)in_stack_fffffffffffffe48);
                      if (sVar12 == 0xffffffffffffffff) {
                        local_8 = (octet *)0xffffffffffffffff;
                      }
                      else {
                        sVar13 = derDec4(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                         (u32)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                        if (sVar13 == 0xffffffffffffffff) {
                          local_8 = (octet *)0xffffffffffffffff;
                        }
                        else {
                          sVar14 = derTSEQDecStop((octet *)in_stack_fffffffffffffe48,
                                                  in_stack_fffffffffffffe40);
                          if (sVar14 == 0xffffffffffffffff) {
                            local_8 = (octet *)0xffffffffffffffff;
                          }
                          else {
                            sVar15 = derTSEQDecStop((octet *)in_stack_fffffffffffffe48,
                                                    in_stack_fffffffffffffe40);
                            if (sVar15 == 0xffffffffffffffff) {
                              local_8 = (octet *)0xffffffffffffffff;
                            }
                            else {
                              sVar16 = derTSEQDecStop((octet *)in_stack_fffffffffffffe48,
                                                      in_stack_fffffffffffffe40);
                              if (sVar16 == 0xffffffffffffffff) {
                                local_8 = (octet *)0xffffffffffffffff;
                              }
                              else {
                                sVar17 = derTSEQDecStart(in_stack_fffffffffffffe48,
                                                         (octet *)in_stack_fffffffffffffe40,
                                                         in_stack_fffffffffffffe38,tag);
                                if (sVar17 == 0xffffffffffffffff) {
                                  local_8 = (octet *)0xffffffffffffffff;
                                }
                                else {
                                  der = (octet *)derOIDDec2(in_stack_fffffffffffffe58,
                                                            in_stack_fffffffffffffe50,
                                                            (char *)in_stack_fffffffffffffe48);
                                  if (der == (octet *)0xffffffffffffffff) {
                                    local_8 = (octet *)0xffffffffffffffff;
                                  }
                                  else {
                                    local_8 = der + sVar17 + sVar16 + sVar15 + sVar14 + sVar13 + 
                                                  sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 +
                                                                                             sVar6 +
                                                                                             sVar5 +
                                                                                             sVar4 +
                                                                                             sVar3 +
                                                                                             sVar2;
                                    len = (size_t *)
                                          derDec4(der,in_stack_fffffffffffffe50,
                                                  (u32)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                                                  in_stack_fffffffffffffe40,
                                                  in_stack_fffffffffffffe38);
                                    if (len == (size_t *)0xffffffffffffffff) {
                                      local_8 = (octet *)0xffffffffffffffff;
                                    }
                                    else {
                                      local_8 = (octet *)((long)len + (long)local_8);
                                      der_00 = (octet *)derTSEQDecStop((octet *)
                                                  in_stack_fffffffffffffe48,
                                                  in_stack_fffffffffffffe40);
                                      if (der_00 == (octet *)0xffffffffffffffff) {
                                        local_8 = (octet *)0xffffffffffffffff;
                                      }
                                      else {
                                        local_8 = der_00 + (long)local_8;
                                        anchor = (der_anchor_t *)
                                                 derTSEQDecStop(der_00,in_stack_fffffffffffffe40);
                                        if (anchor == (der_anchor_t *)0xffffffffffffffff) {
                                          local_8 = (octet *)0xffffffffffffffff;
                                        }
                                        else {
                                          ppoVar1 = &anchor->der;
                                          sVar2 = derTSEQDecStop(der_00,anchor);
                                          if (sVar2 == 0xffffffffffffffff) {
                                            local_8 = (octet *)0xffffffffffffffff;
                                          }
                                          else {
                                            sVar3 = derTOCTDec(der,len,der_00,(size_t)anchor,
                                                               (u32)(sVar2 >> 0x20));
                                            if (sVar3 == 0xffffffffffffffff) {
                                              local_8 = (octet *)0xffffffffffffffff;
                                            }
                                            else {
                                              sVar4 = derTSEQDecStop(der_00,anchor);
                                              if (sVar4 == 0xffffffffffffffff) {
                                                local_8 = (octet *)0xffffffffffffffff;
                                              }
                                              else {
                                                local_8 = local_8 + (long)ppoVar1 +
                                                                    sVar4 + sVar3 + sVar2;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t bpkiEdataDec(octet edata[], size_t* edata_len, octet salt[8],
	size_t* iter, const octet epki[], size_t count)
{
	der_anchor_t EPKI[1];
	der_anchor_t EncryptionAlgId[1];
	der_anchor_t PBES2_params[1];
	der_anchor_t PBKDF2AlgId[1];
	der_anchor_t PBKDF2_params[1];
	der_anchor_t PrfAlgId[1];
	der_anchor_t BeltKwpAlgId[1];
	const octet* ptr = epki;
	// декодировать
	derDecStep(derSEQDecStart(EPKI, ptr, count), ptr, count);
	 derDecStep(derSEQDecStart(EncryptionAlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_id_pbes2), ptr, count);
	  derDecStep(derSEQDecStart(PBES2_params, ptr, count), ptr, count);
	   derDecStep(derSEQDecStart(PBKDF2AlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_id_pbkdf2), ptr, count);
	    derDecStep(derSEQDecStart(PBKDF2_params, ptr, count), ptr, count);
	     derDecStep(derOCTDec2(salt, ptr, count, 8), ptr, count);
	     derDecStep(derSIZEDec(iter, ptr, count), ptr, count);
	     derDecStep(derSEQDecStart(PrfAlgId, ptr, count), ptr, count);
	      derDecStep(derOIDDec2(ptr, count, oid_hmac_hbelt), ptr, count);
	      derDecStep(derNULLDec(ptr, count), ptr, count);
	     derDecStep(derSEQDecStop(ptr, PrfAlgId), ptr, count);
	    derDecStep(derSEQDecStop(ptr, PBKDF2_params), ptr, count);
	   derDecStep(derSEQDecStop(ptr, PBKDF2AlgId), ptr, count);
	   derDecStep(derSEQDecStart(BeltKwpAlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_belt_kwp256), ptr, count);
	    derDecStep(derNULLDec(ptr, count), ptr, count);
	   derDecStep(derSEQDecStop(ptr, BeltKwpAlgId), ptr, count);
	  derDecStep(derSEQDecStop(ptr, PBES2_params), ptr, count);
	 derDecStep(derSEQDecStop(ptr, EncryptionAlgId), ptr, count);
	 derDecStep(derOCTDec(edata, edata_len, ptr, count), ptr, count);
	derDecStep(derSEQDecStop(ptr, EPKI), ptr, count);
	// возвратить длину DER-кода
	return ptr - epki;
}